

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTAircraft.cpp
# Opt level: O2

bool NextCycle(int newCycle)

{
  bool bVar1;
  undefined8 in_R9;
  
  if (currCycle.num < 0) {
    prevCycle.num = newCycle + -1;
    prevCycle.simTime = dataRefs.lastSimTime + -0.1;
  }
  else {
    prevCycle._4_4_ = currCycle._4_4_;
    prevCycle.num = currCycle.num;
    prevCycle.simTime = currCycle.simTime;
    prevCycle.diffTime = currCycle.diffTime;
  }
  currCycle.simTime = dataRefs.lastSimTime;
  currCycle.diffTime = dataRefs.lastSimTime - prevCycle.simTime;
  currCycle.num = newCycle;
  if ((dataRefs.cntAc < 1) ||
     ((0.0 <= currCycle.diffTime && (currCycle.diffTime <= (double)dataRefs.fdBufPeriod)))) {
    LTRegularUpdates();
    bVar1 = DataRefs::ShallDrawLabels(&dataRefs);
    if (bVar1) {
      XPMPEnableAircraftLabels(true);
    }
    else {
      XPMPDisableAircraftLabels();
    }
    bVar1 = true;
  }
  else {
    dataRefs.bReInitAll = true;
    if ((int)dataRefs.iLogLevel < 3) {
      LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTAircraft.cpp"
             ,0x75,"NextCycle",logWARN,
             "Time moved non-linear/jumped by %.1f seconds, will re-init aircraft.",
             SUB84(currCycle.diffTime,0),in_R9,&dataRefs);
    }
    CreateMsgWindow(8.0,logWARN,
                    "Time moved non-linear/jumped by %.1f seconds, will re-init aircraft.",
                    currCycle.diffTime);
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool NextCycle (int newCycle)
{
    if ( currCycle.num >= 0 )    // not the very very first cycle?
        prevCycle = currCycle;
    else
    {
        prevCycle.num = newCycle-1;
        prevCycle.simTime  = dataRefs.GetSimTime() - 0.1;
#ifdef DEBUG
        // initialize frame lengths with 30 FPS
        gFrameLen.fill(1/30.0);
        gFrameLenIter = gFrameLen.begin();
#endif
    }
    currCycle.num = newCycle;
    currCycle.simTime  = dataRefs.GetSimTime();
    
    // the time that has passed since the last cycle
    currCycle.diffTime  = currCycle.simTime - prevCycle.simTime;

#ifdef DEBUG
    // When debugging we want to step through the data and don't mind if
    // we de-synch with reality, so if we notice too long a wait between
    // frames we assume some debugging delay and instead increase buffering time
    if (dataRefs.GetNumAc() > 0)
    {
        if (currCycle.diffTime < 0) {
            // jumped backward...that has nothing to do with debugging
            dataRefs.SetReInitAll(true);
            SHOW_MSG(logWARN, ERR_TIME_NONLINEAR, currCycle.diffTime);
            return false;
        }
        // test for forward movement of time, which here we assume is due to debugging
        else if (currCycle.diffTime > 1.0) {
            const double avgFrameLen = std::accumulate(gFrameLen.cbegin(), gFrameLen.cend(), 0.0) / gFrameLen.size();
            dataRefs.fdBufDebug += currCycle.diffTime;      // increase buffering period by wait time
            dataRefs.fdBufDebug -= avgFrameLen;             // minus an average frame length
            
            // And fix this cycle
            dataRefs.UpdateSimTime();                       // recalc simTime based on fdBufDebug
            currCycle.simTime  = dataRefs.GetSimTime();
            currCycle.diffTime = currCycle.simTime - prevCycle.simTime; // should be about avgFrameLen now
        }
        // otherwise all good, store our frame time
        else {
            *gFrameLenIter = currCycle.diffTime;
            if ((++gFrameLenIter) == gFrameLen.end())
                gFrameLenIter = gFrameLen.begin();
        }
    }
#else
    // time should move forward (positive difference) and not too much either
    // If time moved to far between two calls then we better start over
    // (but no problem if no a/c yet displayed anyway)
    if (dataRefs.GetNumAc() > 0 &&
        (currCycle.diffTime < 0 || currCycle.diffTime > dataRefs.GetFdBufPeriod()) ) {
        // too much time passed...we start over and reinit all aircraft
        dataRefs.SetReInitAll(true);
        SHOW_MSG(logWARN, ERR_TIME_NONLINEAR, currCycle.diffTime);
        return false;
    }
#endif
    
    // All regular updates are collected here
    LTRegularUpdates();
    
    // tell multiplayer lib if we want to see labels
    // (these are very quick calls only setting a variable)
    // as the user can change between views any frame
    // Tell XPMP if we need labels
    if (dataRefs.ShallDrawLabels())
        XPMPEnableAircraftLabels();
    else
        XPMPDisableAircraftLabels();
    
    return true;
}